

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::set(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      *this,base_iterator p)

{
  uint uVar1;
  uint uVar2;
  mapping_type *pmVar3;
  element_type *peVar4;
  wchar_t *pwVar5;
  long lVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  rule_type *prVar9;
  pointer pbVar10;
  difference_type __d_2;
  pointer pbVar11;
  difference_type __d_1;
  pointer pbVar12;
  pointer pbVar13;
  difference_type __d;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  
  pmVar3 = this->map_;
  peVar4 = (pmVar3->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pwVar5 = (pmVar3->begin_)._M_current;
  pbVar11 = (peVar4->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (peVar4->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pbVar13 - (long)pbVar11 >> 4;
  pbVar10 = pbVar11;
  if (0 < (long)uVar7) {
    uVar8 = uVar7;
    do {
      uVar14 = uVar8 >> 1;
      uVar15 = uVar14;
      if (pbVar10[uVar14].offset <= (ulong)((long)p._M_current - (long)pwVar5 >> 2)) {
        uVar15 = ~uVar14 + uVar8;
        pbVar10 = pbVar10 + uVar14 + 1;
      }
      uVar8 = uVar15;
    } while (0 < (long)uVar15);
  }
  if (pbVar10 != pbVar13) {
    do {
      if ((pbVar10->rule & this->mask_) != 0) break;
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar13);
  }
  uVar8 = (long)pbVar10 - (long)pbVar11 >> 4;
  (this->current_).second = uVar8;
  (this->current_).first = uVar8;
  if (this->full_select_ == true) {
    uVar16 = (this->current_).first;
    uVar1 = this->mask_;
    prVar9 = &pbVar11[uVar16 - 1].rule;
    do {
      uVar16 = uVar16 - 1;
      if (((uVar16 == 0xffffffffffffffff) || ((this->current_).first = uVar16, uVar16 == 0)) ||
         (uVar7 == uVar16)) break;
      uVar2 = *prVar9;
      prVar9 = prVar9 + -4;
    } while ((uVar2 & uVar1) == 0);
  }
  else if (pbVar10 != pbVar11) {
    (this->current_).first = uVar8 - 1;
  }
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = pwVar5;
  uVar7 = (this->current_).first;
  peVar4 = (pmVar3->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar6 = (long)(peVar4->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (peVar4->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pbVar12 = (pointer)(lVar6 + uVar7 * 0x10);
  if ((long)pbVar13 - lVar6 >> 4 == uVar7) {
    pbVar12 = pbVar13 + -1;
  }
  pwVar5 = pwVar5 + pbVar12->offset;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = pwVar5;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .second._M_current = pwVar5;
  peVar4 = (pmVar3->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar6 = (long)(peVar4->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (peVar4->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = (long)pbVar13 - lVar6 >> 4;
  pbVar13 = pbVar13 + -1;
  pbVar11 = (pointer)(((long)pbVar10 - (long)pbVar11) + lVar6);
  if (uVar16 == uVar8) {
    pbVar11 = pbVar13;
  }
  pbVar10 = (pointer)(uVar7 * 0x10 + lVar6);
  if (uVar16 == uVar7) {
    pbVar10 = pbVar13;
  }
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .second._M_current = pwVar5 + (pbVar11->offset - pbVar10->offset);
  if (uVar16 != uVar8) {
    (this->value_).rule_ = *(rule_type *)(lVar6 + 8 + uVar8 * 0x10);
  }
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist=std::distance(map_->begin(),p);
                        index_type::const_iterator b=map_->index().begin(),e=map_->index().end();
                        index_type::const_iterator 
                            boundary_point=std::upper_bound(b,e,break_info(dist));
                        while(boundary_point != e && (boundary_point->rule & mask_)==0)
                            boundary_point++;

                        current_.first = current_.second = boundary_point - b;
                        
                        if(full_select_) {
                            while(current_.first > 0) {
                                current_.first --;
                                if(valid_offset(current_.first))
                                    break;
                            }
                        }
                        else {
                            if(current_.first > 0)
                                current_.first --;
                        }
                        value_.first = map_->begin();
                        std::advance(value_.first,get_offset(current_.first));
                        value_.second = value_.first;
                        std::advance(value_.second,get_offset(current_.second) - get_offset(current_.first));

                        update_rule();
                    }